

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

void roaring_bitmap_repair_after_lazy(roaring_bitmap_t *r)

{
  int iVar1;
  undefined8 in_RAX;
  array_container_t *c;
  array_container_t *paVar2;
  uint8_t uVar3;
  long lVar4;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  for (lVar4 = 0; lVar4 < (r->high_low_container).size; lVar4 = lVar4 + 1) {
    uStack_38 = CONCAT17((r->high_low_container).typecodes[lVar4],(undefined7)uStack_38);
    c = (array_container_t *)
        get_writable_copy_if_shared
                  ((r->high_low_container).containers[lVar4],(uint8_t *)((long)&uStack_38 + 7));
    paVar2 = c;
    uVar3 = uStack_38._7_1_;
    switch(uStack_38._7_1_) {
    case '\x01':
      iVar1 = bitset_container_compute_cardinality((bitset_container_t *)c);
      c->cardinality = iVar1;
      uVar3 = '\x01';
      if (iVar1 < 0x1001) {
        paVar2 = array_container_from_bitset((bitset_container_t *)c);
        bitset_container_free((bitset_container_t *)c);
        uVar3 = '\x02';
      }
      break;
    case '\x02':
      break;
    case '\x03':
      paVar2 = (array_container_t *)
               convert_run_to_efficient_container_and_free
                         ((run_container_t *)c,(uint8_t *)((long)&uStack_38 + 7));
      uVar3 = uStack_38._7_1_;
      break;
    case '\x04':
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x1173,"container_t *container_repair_after_lazy(container_t *, uint8_t *)");
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x1175,"container_t *container_repair_after_lazy(container_t *, uint8_t *)");
    }
    (r->high_low_container).containers[lVar4] = paVar2;
    (r->high_low_container).typecodes[lVar4] = uVar3;
  }
  return;
}

Assistant:

void roaring_bitmap_repair_after_lazy(roaring_bitmap_t *r) {
    roaring_array_t *ra = &r->high_low_container;

    for (int i = 0; i < ra->size; ++i) {
        const uint8_t old_type = ra->typecodes[i];
        container_t *old_c = ra->containers[i];
        uint8_t new_type = old_type;
        container_t *new_c = container_repair_after_lazy(old_c, &new_type);
        ra->containers[i] = new_c;
        ra->typecodes[i] = new_type;
    }
}